

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::PolarB::define(PolarB *this,FabArrayBase *fa)

{
  BoxArray *this_00;
  int *piVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar11;
  int iVar12;
  pointer ppVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  mapped_type *this_01;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *this_02
  ;
  _Rb_tree_node_base *p_Var18;
  int n;
  int iVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  Box *box;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  IntVect IVar26;
  Box src_box;
  PolarFn local_2f8;
  PolarFn local_2f0;
  Box bxsnd;
  int src_owner;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box gbx;
  CopyComTag cct;
  int dst_owner;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  IndexType IStack_210;
  Box dst_box;
  Box local_1f0;
  Box local_1d4;
  Box local_1b8;
  Box local_19c;
  Box local_180;
  Box local_164;
  Box local_148;
  PolarFn local_12c;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  IndexType local_114;
  Array<Box,_8> domain_src;
  
  iVar19 = *(int *)(ParallelContext::frames + 0xc);
  this_00 = &fa->boxarray;
  uVar16 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  isects.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar5 = (this->m_domain).bigend.vect[1];
  iVar6 = (this->m_domain).smallend.vect[1];
  iVar12 = ((iVar5 - iVar6) + 1) / 2;
  iVar7 = (this->m_ngrow).vect[0];
  iVar21 = (this->m_domain).smallend.vect[0];
  iVar14 = iVar21 - iVar7;
  iVar21 = iVar21 + -1;
  uVar8 = (this->m_domain).btype.itype;
  iVar9 = (this->m_domain).smallend.vect[2];
  iVar25 = (this->m_domain).bigend.vect[2];
  iVar10 = (this->m_domain).bigend.vect[0];
  IVar26 = Box::type(&this->m_domain);
  uVar15 = IVar26.vect[0] & 1;
  local_1b8.smallend.vect[0] = (iVar10 - uVar15) + 1;
  local_1b8.bigend.vect[0] = iVar7 + (iVar10 - uVar15);
  local_180.smallend.vect[2] = (this->m_ngrow).vect[2];
  local_1f0.smallend.vect[2] = iVar9 - local_180.smallend.vect[2];
  iVar25 = iVar25 + local_180.smallend.vect[2];
  local_1f0._20_8_ = CONCAT44(uVar8,iVar25) & 0xfffffffeffffffff;
  local_1b8._20_8_ = CONCAT44((this->m_domain).btype.itype,iVar25) & 0xfffffffeffffffff;
  iVar7 = (this->m_ngrow).vect[0];
  iVar9 = (this->m_ngrow).vect[1];
  local_180.bigend.vect[2] = local_180.smallend.vect[2] + (this->m_domain).bigend.vect[2];
  local_1f0.bigend.vect[1] = iVar12 + -1;
  local_180.smallend.vect[0] = -iVar7;
  local_180.smallend.vect[1] = -iVar9;
  local_180.smallend.vect[2] = -local_180.smallend.vect[2];
  local_180.bigend.vect[0] = -1;
  local_180.bigend.vect[1] = -1;
  local_180.btype.itype = 0;
  local_164.bigend.vect[0] = -1;
  local_164.btype.itype = 0;
  local_148.bigend.vect[1] = -1;
  local_148.btype.itype = 0;
  local_114.itype = 0;
  uVar3 = *(undefined8 *)(this->m_domain).bigend.vect;
  uVar4 = *(undefined8 *)(this->m_domain).smallend.vect;
  local_164.bigend.vect[1] = (int)((ulong)uVar3 >> 0x20) - (int)((ulong)uVar4 >> 0x20);
  local_2f8.Lx = ((int)uVar3 - (int)uVar4) + 1;
  local_2f8.Ly = local_164.bigend.vect[1] + 1;
  local_164.bigend.vect[1] = local_164.bigend.vect[1] + iVar9;
  local_148.bigend.vect[0] = iVar7 + -1 + local_2f8.Lx;
  local_2f0 = local_2f8;
  local_1f0.smallend.vect[0] = iVar14;
  local_1f0.smallend.vect[1] = iVar6;
  local_1f0.bigend.vect[0] = iVar21;
  local_1d4.smallend.vect[0] = iVar14;
  local_1d4.smallend.vect[1] = iVar12;
  local_1d4.smallend.vect[2] = local_1f0.smallend.vect[2];
  local_1d4.bigend.vect[0] = iVar21;
  local_1d4.bigend.vect[1] = iVar5;
  local_1d4._20_8_ = local_1f0._20_8_;
  local_1b8.smallend.vect[1] = iVar6;
  local_1b8.smallend.vect[2] = local_1f0.smallend.vect[2];
  local_1b8.bigend.vect[1] = local_1f0.bigend.vect[1];
  local_19c.smallend.vect[0] = local_1b8.smallend.vect[0];
  local_19c.smallend.vect[1] = iVar12;
  local_19c.smallend.vect[2] = local_1f0.smallend.vect[2];
  local_19c.bigend.vect[0] = local_1b8.bigend.vect[0];
  local_19c.bigend.vect[1] = iVar5;
  local_19c._20_8_ = local_1b8._20_8_;
  local_164.smallend.vect[0] = local_180.smallend.vect[0];
  local_164.smallend.vect[1] = local_2f8.Ly;
  local_164.smallend.vect[2] = local_180.smallend.vect[2];
  local_164.bigend.vect[2] = local_180.bigend.vect[2];
  local_148.smallend.vect[0] = local_2f8.Lx;
  local_148.smallend.vect[1] = local_180.smallend.vect[1];
  local_148.smallend.vect[2] = local_180.smallend.vect[2];
  local_148.bigend.vect[2] = local_180.bigend.vect[2];
  local_12c = local_2f8;
  local_124 = local_180.smallend.vect[2];
  local_120 = local_148.bigend.vect[0];
  local_11c = local_164.bigend.vect[1];
  local_118 = local_180.bigend.vect[2];
  NonLocalBC::PolarFn::operator()(domain_src._M_elems,&local_2f0,&local_1f0);
  NonLocalBC::PolarFn::operator()(domain_src._M_elems + 1,&local_2f0,&local_1d4);
  NonLocalBC::PolarFn::operator()(domain_src._M_elems + 2,&local_2f0,&local_1b8);
  NonLocalBC::PolarFn::operator()(domain_src._M_elems + 3,&local_2f0,&local_19c);
  NonLocalBC::PolarFn2::operator()(domain_src._M_elems + 4,(PolarFn2 *)&local_2f8,&local_180);
  NonLocalBC::PolarFn2::operator()(domain_src._M_elems + 5,(PolarFn2 *)&local_2f8,&local_164);
  NonLocalBC::PolarFn2::operator()(domain_src._M_elems + 6,(PolarFn2 *)&local_2f8,&local_148);
  NonLocalBC::PolarFn2::operator()(domain_src._M_elems + 7,(PolarFn2 *)&local_2f8,(Box *)&local_12c)
  ;
  pmVar11 = (this->super_CommMetaData).m_SndTags._M_t.
            super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
            ._M_head_impl;
  uVar17 = uVar16 & 0xffffffff;
  if ((int)uVar16 < 1) {
    uVar17 = 0;
  }
  for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
    iVar5 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar16];
    BoxArray::operator[](&gbx,this_00,iVar5);
    if (gbx.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
      gbx.smallend.vect[2] = gbx.smallend.vect[2] - (this->m_ngrow).vect[2];
    }
    if (gbx.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
      gbx.bigend.vect[2] = gbx.bigend.vect[2] + (this->m_ngrow).vect[2];
    }
    uVar20 = 0;
    while( true ) {
      if (uVar20 == 8) break;
      src_box.bigend.vect[1] = gbx.bigend.vect[1];
      src_box.bigend.vect[2] = gbx.bigend.vect[2];
      src_box.btype.itype = gbx.btype.itype;
      src_box.smallend.vect[0] = gbx.smallend.vect[0];
      src_box.smallend.vect[1] = gbx.smallend.vect[1];
      src_box.smallend.vect[2] = gbx.smallend.vect[2];
      src_box.bigend.vect[0] = gbx.bigend.vect[0];
      Box::operator&=(&src_box,domain_src._M_elems + uVar20);
      if ((((src_box.smallend.vect[0] <= src_box.bigend.vect[0]) &&
           (src_box.smallend.vect[1] <= src_box.bigend.vect[1])) &&
          (src_box.smallend.vect[2] <= src_box.bigend.vect[2])) && (src_box.btype.itype < 8)) {
        if (uVar20 < 4) {
          NonLocalBC::PolarFn::operator()(&dst_box,&local_2f0,&src_box);
        }
        else {
          NonLocalBC::PolarFn2::operator()(&dst_box,(PolarFn2 *)&local_2f8,&src_box);
        }
        BoxArray::intersections(this_00,&dst_box,&isects,false,&this->m_ngrow);
        uVar23 = (ulong)((long)isects.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5;
        uVar24 = uVar23 & 0xffffffff;
        if ((int)uVar23 < 1) {
          uVar24 = 0;
        }
        for (lVar22 = 0;
            ppVar13 = isects.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, uVar24 * 0x20 != lVar22;
            lVar22 = lVar22 + 0x20) {
          iVar6 = *(int *)((long)((isects.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                          + lVar22 + -4);
          dst_owner = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              (long)iVar6 * 4);
          if (dst_owner != iVar19) {
            box = (Box *)((long)((isects.
                                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                         + lVar22);
            if (uVar20 < 4) {
              NonLocalBC::PolarFn::operator()(&bxsnd,&local_2f0,box);
            }
            else {
              NonLocalBC::PolarFn2::operator()(&bxsnd,(PolarFn2 *)&local_2f8,box);
            }
            this_01 = std::
                      map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                      ::operator[](pmVar11,&dst_owner);
            cct.dbox.smallend.vect._0_8_ = *(undefined8 *)(box->smallend).vect;
            uVar3 = *(undefined8 *)((long)(ppVar13->second).smallend.vect + lVar22 + 8);
            cct.dbox._20_8_ = *(undefined8 *)((long)(ppVar13->second).bigend.vect + lVar22 + 8);
            cct.dbox.bigend.vect[1] =
                 (int)((ulong)*(undefined8 *)((long)(ppVar13->second).bigend.vect + lVar22) >> 0x20)
            ;
            cct.dbox.smallend.vect[2] = (int)uVar3;
            cct.dbox.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
            cct.sbox.bigend.vect[1] = bxsnd.bigend.vect[1];
            cct.sbox.bigend.vect[2] = bxsnd.bigend.vect[2];
            cct.sbox.btype.itype = bxsnd.btype.itype;
            cct.sbox.smallend.vect[0] = bxsnd.smallend.vect[0];
            cct.sbox.smallend.vect[1] = bxsnd.smallend.vect[1];
            cct.sbox.smallend.vect[2] = bxsnd.smallend.vect[2];
            cct.sbox.bigend.vect[0] = bxsnd.bigend.vect[0];
            cct.dstIndex = iVar6;
            cct.srcIndex = iVar5;
            std::
            vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
            ::emplace_back<amrex::FabArrayBase::CopyComTag>(this_01,&cct);
          }
        }
      }
      uVar20 = uVar20 + 1;
    }
  }
  pmVar11 = (this->super_CommMetaData).m_RcvTags._M_t.
            super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
            .
            super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
            ._M_head_impl;
  for (uVar16 = 0; uVar16 != uVar17; uVar16 = uVar16 + 1) {
    iVar5 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar16];
    BoxArray::operator[](&cct.dbox,this_00,iVar5);
    gbx.bigend.vect[1] = cct.dbox.bigend.vect[1];
    gbx.bigend.vect[2] = cct.dbox.bigend.vect[2];
    gbx.btype.itype = cct.dbox.btype.itype;
    gbx.smallend.vect[0] = cct.dbox.smallend.vect[0];
    gbx.smallend.vect[1] = cct.dbox.smallend.vect[1];
    gbx.smallend.vect[2] = cct.dbox.smallend.vect[2];
    gbx.bigend.vect[0] = cct.dbox.bigend.vect[0];
    Box::grow(&gbx,&this->m_ngrow);
    uVar20 = 0;
    while( true ) {
      if (uVar20 == 8) break;
      src_box.bigend.vect[1] = gbx.bigend.vect[1];
      src_box.bigend.vect[2] = gbx.bigend.vect[2];
      src_box.btype.itype = gbx.btype.itype;
      src_box.smallend.vect[0] = gbx.smallend.vect[0];
      src_box.smallend.vect[1] = gbx.smallend.vect[1];
      src_box.smallend.vect[2] = gbx.smallend.vect[2];
      src_box.bigend.vect[0] = gbx.bigend.vect[0];
      Box::operator&=(&src_box,&local_1f0 + uVar20);
      if (((src_box.smallend.vect[0] <= src_box.bigend.vect[0]) &&
          (src_box.smallend.vect[1] <= src_box.bigend.vect[1])) &&
         ((src_box.smallend.vect[2] <= src_box.bigend.vect[2] && (src_box.btype.itype < 8)))) {
        if (uVar20 < 4) {
          NonLocalBC::PolarFn::operator()(&dst_box,&local_2f0,&src_box);
        }
        else {
          NonLocalBC::PolarFn2::operator()(&dst_box,(PolarFn2 *)&local_2f8,&src_box);
        }
        BoxArray::intersections(this_00,&dst_box,&isects);
        uVar23 = (ulong)((long)isects.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)isects.
                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5;
        uVar24 = uVar23 & 0xffffffff;
        if ((int)uVar23 < 1) {
          uVar24 = 0;
        }
        for (lVar22 = 0; uVar24 * 0x20 != lVar22; lVar22 = lVar22 + 0x20) {
          iVar6 = *(int *)((long)((isects.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                          + lVar22 + -4);
          piVar1 = (int *)((long)((isects.
                                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->second).smallend.vect
                          + lVar22);
          bxsnd.smallend.vect._0_8_ = *(undefined8 *)piVar1;
          puVar2 = (undefined8 *)
                   ((long)((isects.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second).bigend.vect + lVar22
                   );
          uVar3 = *puVar2;
          bxsnd._20_8_ = puVar2[1];
          bxsnd.smallend.vect[2] = (int)*(undefined8 *)(piVar1 + 2);
          bxsnd.bigend.vect[0] = (int)uVar3;
          bxsnd.bigend.vect[1] = (int)((ulong)uVar3 >> 0x20);
          if (bxsnd.smallend.vect[2] == (this->m_domain).smallend.vect[2]) {
            bxsnd.smallend.vect[2] = bxsnd.smallend.vect[2] - (this->m_ngrow).vect[2];
          }
          if (bxsnd.bigend.vect[2] == (this->m_domain).bigend.vect[2]) {
            bxsnd.bigend.vect[2] = bxsnd.bigend.vect[2] + (this->m_ngrow).vect[2];
          }
          if (uVar20 < 4) {
            NonLocalBC::PolarFn::operator()((Box *)&dst_owner,&local_2f0,&bxsnd);
          }
          else {
            NonLocalBC::PolarFn2::operator()((Box *)&dst_owner,(PolarFn2 *)&local_2f8,&bxsnd);
          }
          src_owner = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              (long)iVar6 * 4);
          cct.dbox.smallend.vect[1] = iStack_224;
          cct.dbox.smallend.vect[0] = dst_owner;
          cct.dbox.bigend.vect[1] = iStack_218;
          cct.dbox.bigend.vect[2] = iStack_214;
          cct.dbox.btype.itype = IStack_210.itype;
          cct.dbox.smallend.vect[2] = iStack_220;
          cct.dbox.bigend.vect[0] = iStack_21c;
          cct.sbox.bigend.vect[1] = bxsnd.bigend.vect[1];
          cct.sbox.bigend.vect[2] = bxsnd.bigend.vect[2];
          cct.sbox.btype.itype = bxsnd.btype.itype;
          cct.sbox.smallend.vect[0] = bxsnd.smallend.vect[0];
          cct.sbox.smallend.vect[1] = bxsnd.smallend.vect[1];
          cct.sbox.smallend.vect[2] = bxsnd.smallend.vect[2];
          cct.sbox.bigend.vect[0] = bxsnd.bigend.vect[0];
          cct.dstIndex = iVar5;
          cct.srcIndex = iVar6;
          if (src_owner == iVar19) {
            this_02 = (this->super_CommMetaData).m_LocTags._M_t.
                      super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                      ._M_head_impl;
          }
          else {
            this_02 = std::
                      map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                      ::operator[](pmVar11,&src_owner);
          }
          std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::push_back(this_02,&cct);
        }
      }
      uVar20 = uVar20 + 1;
    }
  }
  for (iVar19 = 0; iVar19 != 2; iVar19 = iVar19 + 1) {
    lVar22 = *(long *)((this->m_ngrow).vect + (ulong)(iVar19 != 0) * 2 + -4);
    for (p_Var18 = *(_Rb_tree_node_base **)(lVar22 + 0x18);
        p_Var18 != (_Rb_tree_node_base *)(lVar22 + 8);
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var18[1]._M_parent,p_Var18[1]._M_left);
    }
  }
  std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
  ~_Vector_base(&isects.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
               );
  return;
}

Assistant:

void
FabArrayBase::PolarB::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    const int ymid = m_domain.length(1) / 2;
    Box lox_box = amrex::adjCellLo(m_domain, 0, m_ngrow[0]);
    Box hix_box = amrex::adjCellHi(m_domain, 0, m_ngrow[0]);
#if (AMREX_SPACEDIM == 3)
    lox_box.grow(2, m_ngrow[2]);
    hix_box.grow(2, m_ngrow[2]);
#endif
    Box loxy_corner(IntVect{AMREX_D_DECL(-m_ngrow[0],-m_ngrow[1],-m_ngrow[2])},
                    IntVect{AMREX_D_DECL(-1,-1,m_domain.bigEnd(2)+m_ngrow[2])});
    Array<Box,8> const domain_dst{Box(lox_box).setBig  (1,ymid-1),
                                  Box(lox_box).setSmall(1,ymid  ),
                                  Box(hix_box).setBig  (1,ymid-1),
                                  Box(hix_box).setSmall(1,ymid  ),
                                  loxy_corner,
                                  amrex::shift(loxy_corner,1,m_domain.length(1)+m_ngrow[1]),
                                  amrex::shift(loxy_corner,0,m_domain.length(0)+m_ngrow[0]),
                                  amrex::shift(loxy_corner,
                                               IntVect{AMREX_D_DECL(m_domain.length(0)+m_ngrow[0],
                                                                    m_domain.length(1)+m_ngrow[1],
                                                                    0)})};

    auto const convert = NonLocalBC::PolarFn{m_domain.length(0), m_domain.length(1)};
    auto const convert_corner = NonLocalBC::PolarFn2{m_domain.length(0), m_domain.length(1)};

    Array<Box,8> const domain_src{convert(domain_dst[0]), convert(domain_dst[1]),
                                  convert(domain_dst[2]), convert(domain_dst[3]),
                                  convert_corner(domain_dst[4]), convert_corner(domain_dst[5]),
                                  convert_corner(domain_dst[6]), convert_corner(domain_dst[7])};

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
#if (AMREX_SPACEDIM == 3)
        if (gbx.smallEnd(2) == m_domain.smallEnd(2)) {
            gbx.growLo(2, m_ngrow[2]);
        }
        if (gbx.bigEnd(2) == m_domain.bigEnd(2)) {
            gbx.growHi(2, m_ngrow[2]);
        }
#endif

        for (int n = 0; n < 8; ++n) {
            Box const src_box = gbx & domain_src[n];
            if (src_box.ok()) {
                Box const dst_box = (n<4) ? convert(src_box) : convert_corner(src_box);
                ba.intersections(dst_box, isects, false, m_ngrow);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int krcv = isects[j].first;
                    const Box& bxrcv = isects[j].second;
                    const int dst_owner = dm[krcv];
                    if (dst_owner != myproc) // local copy will be dealt with later
                    {
                        Box const bxsnd = (n<4) ? convert(bxrcv) : convert_corner(bxrcv);
                        send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                                krcv, ksnd));
                    }
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        for (int n = 0; n < 8; ++n) {
            Box const dst_box = gbx & domain_dst[n];
            if (dst_box.ok()) {
                Box const src_box = (n<4) ? convert(dst_box) : convert_corner(dst_box);
                ba.intersections(src_box, isects);
                for (int j = 0, M = isects.size(); j < M; ++j) {
                    const int ksnd = isects[j].first;
                    Box bxsnd = isects[j].second;
                    // the ghosts at lo-x and hi-z boundary are the source too
#if (AMREX_SPACEDIM == 3)
                    if (bxsnd.smallEnd(2) == m_domain.smallEnd(2)) {
                        bxsnd.growLo(2, m_ngrow[2]);
                    }
                    if (bxsnd.bigEnd(2) == m_domain.bigEnd(2)) {
                        bxsnd.growHi(2, m_ngrow[2]);
                    }
#endif
                    const Box bxrcv = (n<4) ? convert(bxsnd) : convert_corner(bxsnd);
                    const int src_owner = dm[ksnd];
                    FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                    if (src_owner == myproc) {
                        m_LocTags->push_back(cct);
                    } else {
                        recv_tags[src_owner].push_back(cct);
                    }
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}